

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

xmlBufPtr xmlBufCreate(void)

{
  uint uVar1;
  xmlBufPtr buf;
  uint *puVar2;
  xmlBufferAllocationScheme *pxVar3;
  xmlChar *pxVar4;
  uint uVar5;
  ulong uVar6;
  
  buf = (xmlBufPtr)(*xmlMalloc)(0x40);
  if (buf == (xmlBufPtr)0x0) {
    buf = (xmlBufPtr)0x0;
    xmlBufMemoryError((xmlBufPtr)0x0,"creating buffer");
  }
  else {
    buf->use = 0;
    buf->error = 0;
    buf->buffer = (xmlBufferPtr)0x0;
    puVar2 = (uint *)__xmlDefaultBufferSize();
    uVar1 = *puVar2;
    uVar5 = 0x7fffffff;
    if (uVar1 < 0x7fffffff) {
      uVar5 = uVar1;
    }
    buf->size = (long)(int)uVar1;
    buf->compat_size = uVar5;
    uVar6 = 0x7fffffff;
    if (buf->use < 0x7fffffff) {
      uVar6 = buf->use;
    }
    buf->compat_use = (uint)uVar6;
    pxVar3 = __xmlBufferAllocScheme();
    buf->alloc = *pxVar3;
    pxVar4 = (xmlChar *)(*xmlMallocAtomic)(buf->size);
    buf->content = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) {
      xmlBufMemoryError(buf,"creating buffer");
      (*xmlFree)(buf);
      buf = (xmlBufPtr)0x0;
    }
    else {
      *pxVar4 = '\0';
      buf->contentIO = (xmlChar *)0x0;
    }
  }
  return buf;
}

Assistant:

xmlBufPtr
xmlBufCreate(void) {
    xmlBufPtr ret;

    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->error = 0;
    ret->buffer = NULL;
    ret->size = xmlDefaultBufferSize;
    UPDATE_COMPAT(ret);
    ret->alloc = xmlBufferAllocScheme;
    ret->content = (xmlChar *) xmlMallocAtomic(ret->size);
    if (ret->content == NULL) {
	xmlBufMemoryError(ret, "creating buffer");
	xmlFree(ret);
        return(NULL);
    }
    ret->content[0] = 0;
    ret->contentIO = NULL;
    return(ret);
}